

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O1

FloatRect __thiscall sf::Transform::transformRect(Transform *this,FloatRect *rectangle)

{
  int i;
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  FloatRect FVar16;
  Vector2f points [4];
  
  fVar2 = rectangle->left;
  fVar6 = rectangle->top;
  fVar7 = (float)*(undefined8 *)(this->m_matrix + 4);
  fVar4 = fVar6 * fVar7;
  fVar11 = (float)((ulong)*(undefined8 *)(this->m_matrix + 4) >> 0x20);
  fVar5 = fVar6 * fVar11;
  fVar3 = (float)*(undefined8 *)this->m_matrix;
  fVar12 = fVar2 * fVar3;
  fVar10 = (float)((ulong)*(undefined8 *)this->m_matrix >> 0x20);
  fVar13 = fVar2 * fVar10;
  fVar8 = (float)*(undefined8 *)(this->m_matrix + 0xc);
  fVar14 = fVar12 + fVar4 + fVar8;
  fVar9 = (float)((ulong)*(undefined8 *)(this->m_matrix + 0xc) >> 0x20);
  fVar15 = fVar13 + fVar5 + fVar9;
  fVar6 = fVar6 + rectangle->height;
  fVar7 = fVar6 * fVar7;
  fVar6 = fVar6 * fVar11;
  points[1].y = fVar13 + fVar6 + fVar9;
  points[1].x = fVar12 + fVar7 + fVar8;
  fVar2 = fVar2 + rectangle->width;
  fVar3 = fVar2 * fVar3;
  fVar2 = fVar2 * fVar10;
  points[2].x = fVar4 + fVar3 + fVar8;
  points[2].y = fVar5 + fVar2 + fVar9;
  points[3].x = fVar3 + fVar7 + fVar8;
  points[3].y = fVar2 + fVar6 + fVar9;
  lVar1 = 1;
  fVar2 = fVar15;
  fVar6 = fVar14;
  do {
    fVar3 = points[lVar1].x;
    fVar4 = fVar3;
    if ((fVar6 <= fVar3) && (fVar4 = fVar6, fVar14 < fVar3)) {
      fVar14 = fVar3;
    }
    fVar6 = fVar4;
    fVar3 = points[lVar1].y;
    fVar4 = fVar3;
    if ((fVar2 <= fVar3) && (fVar4 = fVar2, fVar15 < fVar3)) {
      fVar15 = fVar3;
    }
    fVar2 = fVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  FVar16.top = fVar2;
  FVar16.left = fVar6;
  FVar16.width = fVar14 - fVar6;
  FVar16.height = fVar15 - fVar2;
  return FVar16;
}

Assistant:

FloatRect Transform::transformRect(const FloatRect& rectangle) const
{
    // Transform the 4 corners of the rectangle
    const Vector2f points[] =
    {
        transformPoint(rectangle.left, rectangle.top),
        transformPoint(rectangle.left, rectangle.top + rectangle.height),
        transformPoint(rectangle.left + rectangle.width, rectangle.top),
        transformPoint(rectangle.left + rectangle.width, rectangle.top + rectangle.height)
    };

    // Compute the bounding rectangle of the transformed points
    float left = points[0].x;
    float top = points[0].y;
    float right = points[0].x;
    float bottom = points[0].y;
    for (int i = 1; i < 4; ++i)
    {
        if      (points[i].x < left)   left = points[i].x;
        else if (points[i].x > right)  right = points[i].x;
        if      (points[i].y < top)    top = points[i].y;
        else if (points[i].y > bottom) bottom = points[i].y;
    }

    return FloatRect(left, top, right - left, bottom - top);
}